

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
          *other)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ActualDstType actualDst;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  *other_1;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  uVar1 = *(ulong *)(*(long *)other + 0x10);
  uVar2 = *(ulong *)(*(long *)(other + 8) + 8);
  if ((uVar2 != 0 && uVar1 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar2),0) <
      (long)uVar1)) {
LAB_001114b2:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (-1 < (long)(uVar2 | uVar1)) {
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this,uVar2 * uVar1,uVar1,uVar2);
    uVar1 = *(ulong *)(*(long *)other + 0x10);
    uVar2 = *(ulong *)(*(long *)(other + 8) + 8);
    if ((*(ulong *)(this + 8) != uVar1) || (*(ulong *)(this + 0x10) != uVar2)) {
      if ((long)(uVar2 | uVar1) < 0) goto LAB_00111493;
      if ((uVar2 != 0 && uVar1 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar2),0) <
          (long)uVar1)) goto LAB_001114b2;
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,uVar2 * uVar1,uVar1,uVar2);
    }
    internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)this,
               (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other,
               (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(other + 8));
    return;
  }
LAB_00111493:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/PlainObjectBase.h"
                ,0x11d,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }